

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcComms.cpp
# Opt level: O0

string * __thiscall helics::ipc::IpcComms::getAddress_abi_cxx11_(IpcComms *this)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000028;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000030;
  
  std::__cxx11::string::string(in_stack_00000030,in_stack_00000028);
  return in_RDI;
}

Assistant:

std::string IpcComms::getAddress() const
    {
        return localTargetAddress;
    }